

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O3

void object_notify(GDBusObject *object,GDBusInterface *interface)

{
  long lVar1;
  undefined8 uVar2;
  
  lVar1 = g_dbus_interface_get_info(interface);
  if (lVar1 != 0) {
    uVar2 = g_type_check_instance_cast(object,0x50);
    g_object_notify(uVar2,*(undefined8 *)(lVar1 + 0x30));
    return;
  }
  return;
}

Assistant:

static void
object_notify (GDBusObject *object, GDBusInterface *interface)
{
  _ExtendedGDBusInterfaceInfo *info = (_ExtendedGDBusInterfaceInfo *) g_dbus_interface_get_info (interface);
  /* info can be NULL if the other end is using a D-Bus interface we don't know
   * anything about, for example old generated code in this process talking to
   * newer generated code in the other process. */
  if (info != NULL)
    g_object_notify (G_OBJECT (object), info->hyphen_name);
}